

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O3

string * LiteScript::String::ConvertToUTF8(string *__return_storage_ptr__,u32string *str)

{
  char32_t cVar1;
  char cVar2;
  ulong uVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (ulong)(uint)str->_M_string_length;
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar4];
      cVar2 = (char)__return_storage_ptr__;
      if (0x7f < (uint)cVar1) {
        if (0x7ff < (uint)cVar1) {
          if (0xffff < (uint)cVar1) {
            std::__cxx11::string::push_back(cVar2);
          }
          std::__cxx11::string::push_back(cVar2);
        }
        std::__cxx11::string::push_back(cVar2);
      }
      std::__cxx11::string::push_back(cVar2);
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LiteScript::String::ConvertToUTF8(const std::u32string& str) {
    std::string res;
    for (unsigned int i = 0, sz = str.size(); i < sz; i++) {
        if (str[i] < 0x80) {
            //1 byte
            res.push_back((unsigned char)(str[i]));
        }
        else {
            if (str[i] < 0x800) {
                //2 bytes
                res.push_back((unsigned char) (0b11000000 | (str[i] >> 6)));
            }
            else {
                if (str[i] < 0x10000) {
                    //3 bytes
                    res.push_back((unsigned char) (0b11100000 | (str[i] >> 12)));
                } else {
                    //4 bytes
                    res.push_back((unsigned char) (0b11110000 | (str[i] >> 18)));
                    res.push_back((unsigned char) (0b10000000 | ((str[i] >> 12) & 0b00111111)));
                }
                res.push_back((unsigned char) (0b10000000 | ((str[i] >> 6) & 0b00111111)));
            }
            res.push_back((unsigned char) (0b10000000 | (str[i] & 0b00111111)));
        }
    }
    return res;
}